

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

void activate_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table,_Bool active)

{
  ecs_vector_t *vector;
  ecs_table_t *table_00;
  int32_t iVar1;
  long *plVar2;
  void *pvVar3;
  undefined7 in_register_00000009;
  long lVar4;
  uint index;
  long lVar5;
  int iVar6;
  ecs_vector_t **ppeVar7;
  bool bVar8;
  ecs_vector_t *dst_array;
  ecs_vector_t *local_70;
  uint local_64;
  ecs_vector_t *local_60;
  ecs_query_t *local_58;
  ecs_world_t *local_50;
  long *local_48;
  long local_40;
  ecs_table_t *local_38;
  
  vector = (&query->tables)[CONCAT71(in_register_00000009,active) & 0xffffffff];
  local_70 = (&query->tables)[!active];
  local_38 = table;
  plVar2 = (long *)_ecs_map_get(query->table_indices,0x10,(ulong)table->id);
  table_00 = local_38;
  if (plVar2 != (long *)0x0) {
    lVar4 = (long)(int)plVar2[1];
    local_60 = vector;
    local_50 = world;
    if (lVar4 < 1) {
      bVar8 = true;
    }
    else {
      lVar5 = 0;
      local_64 = (uint)active;
      iVar6 = 0;
      local_58 = query;
      local_48 = plVar2;
      local_40 = lVar4;
      do {
        index = *(uint *)(*plVar2 + lVar5 * 4);
        if ((int)index < 0) {
          if (active) {
            index = ~index;
            goto LAB_001191e1;
          }
        }
        else if (!active) {
LAB_001191e1:
          pvVar3 = _ecs_vector_get(vector,0x50,0x10,index);
          _ecs_assert(*(ecs_table_t **)((long)pvVar3 + 8) == table_00,0xc,(char *)0x0,
                      "mt->iter_data.table == table",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x6f2);
          if (*(ecs_table_t **)((long)pvVar3 + 8) != table_00) {
            __assert_fail("mt->iter_data.table == table",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x6f2,
                          "void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)")
            ;
          }
          iVar6 = iVar6 + 1;
          iVar1 = move_table(local_58,table_00,index,&local_70,vector,SUB41(local_64,0));
          *(int32_t *)(*local_48 + lVar5 * 4) = iVar1;
          lVar4 = local_40;
          plVar2 = local_48;
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      bVar8 = iVar6 == 0;
      query = local_58;
    }
    if (!bVar8) {
      if (query->system != 0) {
        iVar1 = ecs_vector_count(local_70);
        if (active) {
          if (iVar1 != 1) goto LAB_001192cc;
        }
        else {
          iVar1 = ecs_vector_count(local_60);
          if (iVar1 != 0) goto LAB_001192cc;
        }
        ecs_system_activate(local_50,query->system,active,(EcsSystem *)0x0);
      }
LAB_001192cc:
      ppeVar7 = &query->empty_tables;
      if (active) {
        ppeVar7 = &query->tables;
      }
      *ppeVar7 = local_70;
      query->needs_reorder = true;
      return;
    }
    ppeVar7 = &query->empty_tables;
    if (active) {
      ppeVar7 = &query->tables;
    }
    *ppeVar7 = local_70;
  }
  _ecs_assert((_Bool)((byte)(query->flags >> 8) & 1),0xc,(char *)0x0,
              "(query->flags & EcsQueryIsSubquery) != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x716);
  if ((query->flags & 0x100) != 0) {
    return;
  }
  __assert_fail("(query->flags & (256)) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x716,"void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)");
}

Assistant:

static
void activate_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table,
    bool active)
{
    (void)world;
    
    ecs_vector_t *src_array, *dst_array;
    int32_t activated = 0;

    if (active) {
        src_array = query->empty_tables;
        dst_array = query->tables;
    } else {
        src_array = query->tables;
        dst_array = query->empty_tables;
    }

    ecs_table_indices_t *ti = ecs_map_get(
        query->table_indices, ecs_table_indices_t, table->id);

    if (ti) {
        int32_t i, count = ti->count;
        for (i = 0; i < count; i ++) {
            int32_t index = ti->indices[i];

            if (index < 0) {
                if (!active) {
                    /* If table is already inactive, no need to move */
                    continue;
                }
                index = index * -1 - 1;
            } else {
                if (active) {
                    /* If table is already active, no need to move */
                    continue;
                }
            }

            ecs_matched_table_t *mt = ecs_vector_get(
                src_array, ecs_matched_table_t, index);
            ecs_assert(mt->iter_data.table == table, ECS_INTERNAL_ERROR, NULL);
            (void)mt;
            
            activated ++;

            ti->indices[i] = move_table(
                query, table, index, &dst_array, src_array, active);
        }

        if (activated) {
            /* Activate system if registered with query */
#ifdef FLECS_SYSTEMS_H
            if (query->system) {
                int32_t dst_count = ecs_vector_count(dst_array);
                if (active) {
                    if (dst_count == 1) {
                        ecs_system_activate(world, query->system, true, NULL);
                    }
                } else if (ecs_vector_count(src_array) == 0) {
                    ecs_system_activate(world, query->system, false, NULL);
                }
            }
#endif
        }

        if (active)  {
            query->tables = dst_array;
        } else {
            query->empty_tables = dst_array;
        }
    }
    
    if (!activated) {
        /* Received an activate event for a table we're not matched with. This
         * can only happen if this is a subquery */
        ecs_assert((query->flags & EcsQueryIsSubquery) != 0, 
            ECS_INTERNAL_ERROR, NULL);
        return;
    }

    /* Signal query it needs to reorder tables. Doing this in place could slow
     * down scenario's where a large number of tables is matched with an ordered
     * query. Since each table would trigger the activate signal, there would be
     * as many sorts as added tables, vs. only one when ordering happens when an
     * iterator is obtained. */
    query->needs_reorder = true;
}